

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
remove_extension<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename)

{
  long lVar1;
  string *in_RSI;
  size_type p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if ((lVar1 == 0) || (lVar1 == -1)) {
    std::__cxx11::string::string((string *)filename,in_RSI);
  }
  else {
    std::__cxx11::string::substr((ulong)filename,(ulong)in_RSI);
  }
  return filename;
}

Assistant:

T remove_extension(T const& filename)
{
	typename T::size_type const p(filename.find_last_of('.'));
	return p > 0 && p != T::npos ? filename.substr(0, p) : filename;
}